

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Func::EndClone(Func *this)

{
  Cloner *this_00;
  JitArenaAllocator *this_01;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->parentFunc != (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x595,"(this->IsTopFunc())","this->IsTopFunc()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->m_cloner != (Cloner *)0x0) {
    Cloner::Finish(this->m_cloner);
    this_00 = this->m_cloner;
    this_01 = this_00->alloc;
    Cloner::~Cloner(this_00);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_01,this_00
               ,0x38);
    this->m_cloner = (Cloner *)0x0;
  }
  return;
}

Assistant:

void
Func::EndClone()
{
    Assert(this->IsTopFunc());
    if (m_cloner)
    {
        m_cloner->Finish();
        JitAdelete(m_cloner->alloc, m_cloner);
        m_cloner = nullptr;
    }
}